

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

int ipc_helper_send_zero(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  void *pvVar3;
  undefined8 *extraout_RDX;
  uv_pipe_t *__size;
  uv_buf_t local_18;
  
  local_18 = uv_buf_init((char *)0x0,0);
  puVar2 = uv_default_loop();
  __size = &channel;
  iVar1 = uv_pipe_init(puVar2,&channel,0);
  if (iVar1 == 0) {
    __size = (uv_pipe_t *)0x0;
    uv_pipe_open(&channel,0);
    iVar1 = uv_is_readable((uv_stream_t *)&channel);
    if (iVar1 != 1) goto LAB_00160b59;
    iVar1 = uv_is_writable((uv_stream_t *)&channel);
    if (iVar1 != 1) goto LAB_00160b5e;
    iVar1 = uv_is_closing((uv_handle_t *)&channel);
    if (iVar1 != 0) goto LAB_00160b63;
    __size = &channel;
    iVar1 = uv_write(&write_req,(uv_stream_t *)&channel,&local_18,1,send_zero_write_cb);
    if (iVar1 != 0) goto LAB_00160b68;
    puVar2 = uv_default_loop();
    __size = (uv_pipe_t *)0x0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00160b6d;
    if (send_zero_write == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      __size = (uv_pipe_t *)0x0;
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00160b77;
    }
  }
  else {
    ipc_helper_send_zero_cold_1();
LAB_00160b59:
    ipc_helper_send_zero_cold_2();
LAB_00160b5e:
    ipc_helper_send_zero_cold_3();
LAB_00160b63:
    ipc_helper_send_zero_cold_4();
LAB_00160b68:
    ipc_helper_send_zero_cold_5();
LAB_00160b6d:
    ipc_helper_send_zero_cold_6();
  }
  ipc_helper_send_zero_cold_7();
LAB_00160b77:
  ipc_helper_send_zero_cold_8();
  if ((int)__size == 0) {
    send_zero_write = send_zero_write + 1;
    return extraout_EAX;
  }
  send_zero_write_cb_cold_1();
  pvVar3 = malloc((size_t)__size);
  *extraout_RDX = pvVar3;
  extraout_RDX[1] = __size;
  return (int)pvVar3;
}

Assistant:

int ipc_helper_send_zero(void) {
  int r;
  uv_buf_t zero_buf;

  zero_buf = uv_buf_init(0, 0);

  r = uv_pipe_init(uv_default_loop(), &channel, 0);
  ASSERT(r == 0);

  uv_pipe_open(&channel, 0);

  ASSERT(1 == uv_is_readable((uv_stream_t*) &channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*) &channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &channel));

  r = uv_write(&write_req,
               (uv_stream_t*)&channel,
               &zero_buf,
               1,
               send_zero_write_cb);

  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(send_zero_write == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}